

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int ly_set_rm(ly_set *set,void *node)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (node != (void *)0x0 && set != (ly_set *)0x0) {
    uVar1 = set->number;
    if (uVar1 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      do {
        if ((set->set).s[uVar3] == (lys_node *)node) goto LAB_0016f68e;
        uVar3 = uVar3 + 1;
      } while (uVar1 != (uint)uVar3);
      uVar3 = (ulong)uVar1;
    }
LAB_0016f68e:
    if ((uint)uVar3 != uVar1) {
      iVar2 = ly_set_rm_index(set,(uint)uVar3);
      return iVar2;
    }
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","ly_set_rm");
  return 1;
}

Assistant:

API int
ly_set_rm(struct ly_set *set, void *node)
{
    unsigned int i;

    if (!set || !node) {
        LOGARG;
        return EXIT_FAILURE;
    }

    /* get index */
    for (i = 0; i < set->number; i++) {
        if (set->set.g[i] == node) {
            break;
        }
    }
    if (i == set->number) {
        /* node is not in set */
        LOGARG;
        return EXIT_FAILURE;
    }

    return ly_set_rm_index(set, i);
}